

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDGVerifier.cpp
# Opt level: O1

int __thiscall
dg::LLVMDGVerifier::verify
          (LLVMDGVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  
  checkMainProc(this);
  for (p_Var2 = (_Rb_tree_node_base *)constructedFunctions._24_8_;
      p_Var2 != (_Rb_tree_node_base *)(constructedFunctions + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    checkGraph(this,*(Function **)(p_Var2 + 1),(LLVMDependenceGraph *)p_Var2[1]._M_parent);
  }
  iVar1 = fflush(_stderr);
  return CONCAT31((int3)((uint)iVar1 >> 8),this->faults == 0);
}

Assistant:

bool LLVMDGVerifier::verify() {
    checkMainProc();

    extern std::map<llvm::Value *, LLVMDependenceGraph *> constructedFunctions;
    for (auto &it : constructedFunctions)
        checkGraph(llvm::cast<llvm::Function>(it.first), it.second);

    fflush(stderr);
    return faults == 0;
}